

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O3

int IDASetMaxNumJacsIC(void *ida_mem,int maxnj)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x2ea;
  }
  else {
    if (0 < maxnj) {
      *(int *)((long)ida_mem + 0x22c) = maxnj;
      return 0;
    }
    msgfmt = "maxnj <= 0 illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x2f2;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetMaxNumJacsIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDASetMaxNumJacsIC(void* ida_mem, int maxnj)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (maxnj <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MAXNJ);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_maxnj = maxnj;

  return (IDA_SUCCESS);
}